

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * Matrix3f::rotation(Vector3f *rDirection,float radians)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float *pfVar13;
  Matrix3f *in_RDI;
  float in_XMM0_Da;
  float fVar14;
  float fVar15;
  double dVar16;
  float z;
  float y;
  float x;
  float sinTheta;
  float cosTheta;
  Vector3f normalizedDirection;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Vector3f local_20;
  float local_14;
  
  local_14 = in_XMM0_Da;
  Vector3f::normalized((Vector3f *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  dVar16 = cos((double)local_14);
  fVar14 = (float)dVar16;
  dVar16 = sin((double)local_14);
  fVar15 = (float)dVar16;
  pfVar13 = Vector3f::x(&local_20);
  fVar1 = *pfVar13;
  pfVar13 = Vector3f::y(&local_20);
  fVar2 = *pfVar13;
  pfVar13 = Vector3f::z(&local_20);
  fVar3 = *pfVar13;
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar1 * fVar1)),
                           ZEXT416((uint)fVar14));
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar2 * fVar1)),
                           ZEXT416((uint)-(fVar3 * fVar15)));
  auVar6 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar3 * fVar1)),
                           ZEXT416((uint)(fVar2 * fVar15)));
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar1 * fVar2)),
                           ZEXT416((uint)(fVar3 * fVar15)));
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar2 * fVar2)),
                           ZEXT416((uint)fVar14));
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar3 * fVar2)),
                           ZEXT416((uint)-(fVar1 * fVar15)));
  auVar10 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar1 * fVar3)),
                            ZEXT416((uint)-(fVar2 * fVar15)));
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar2 * fVar3)),
                            ZEXT416((uint)(fVar1 * fVar15)));
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar14)),ZEXT416((uint)(fVar3 * fVar3)),
                            ZEXT416((uint)fVar14));
  Matrix3f(in_RDI,auVar4._0_4_,auVar5._0_4_,auVar6._0_4_,auVar7._0_4_,auVar8._0_4_,auVar9._0_4_,
           auVar10._0_4_,auVar11._0_4_,auVar12._0_4_);
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::rotation( const Vector3f& rDirection, float radians )
{
	Vector3f normalizedDirection = rDirection.normalized();
	
	float cosTheta = cos( radians );
	float sinTheta = sin( radians );

	float x = normalizedDirection.x();
	float y = normalizedDirection.y();
	float z = normalizedDirection.z();

	return Matrix3f
		(
			x * x * ( 1.0f - cosTheta ) + cosTheta,			y * x * ( 1.0f - cosTheta ) - z * sinTheta,		z * x * ( 1.0f - cosTheta ) + y * sinTheta,
			x * y * ( 1.0f - cosTheta ) + z * sinTheta,		y * y * ( 1.0f - cosTheta ) + cosTheta,			z * y * ( 1.0f - cosTheta ) - x * sinTheta,
			x * z * ( 1.0f - cosTheta ) - y * sinTheta,		y * z * ( 1.0f - cosTheta ) + x * sinTheta,		z * z * ( 1.0f - cosTheta ) + cosTheta
		);
}